

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O2

void __thiscall
Assimp::PretransformVertices::ApplyTransform
          (PretransformVertices *this,aiMesh *mesh,aiMatrix4x4 *mat)

{
  aiVector3D *paVar1;
  bool bVar2;
  uint uVar3;
  aiMatrix3x3t<float> *paVar4;
  aiVector3t<float> *paVar5;
  uint i;
  ulong uVar6;
  uint i_1;
  long lVar7;
  float fVar8;
  aiVector3t<float> aVar9;
  aiMatrix3x3 m;
  aiMatrix3x3t<float> local_80;
  aiMatrix3x3t<float> local_58;
  
  bVar2 = aiMatrix4x4t<float>::IsIdentity(mat);
  if (!bVar2) {
    if (((mesh->mFaces != (aiFace *)0x0) && (mesh->mNumFaces != 0)) &&
       (fVar8 = aiMatrix4x4t<float>::Determinant(mat), fVar8 < 0.0)) {
      FlipWindingOrderProcess::ProcessMesh(mesh);
    }
    uVar3 = mesh->mNumVertices;
    if (uVar3 != 0 && mesh->mVertices != (aiVector3D *)0x0) {
      lVar7 = 0;
      for (uVar6 = 0; uVar6 < uVar3; uVar6 = uVar6 + 1) {
        aVar9 = ::operator*(mat,(aiVector3t<float> *)((long)&mesh->mVertices->x + lVar7));
        paVar1 = mesh->mVertices;
        *(long *)((long)&paVar1->x + lVar7) = aVar9._0_8_;
        *(float *)((long)&paVar1->z + lVar7) = aVar9.z;
        uVar3 = mesh->mNumVertices;
        lVar7 = lVar7 + 0xc;
      }
    }
    if ((mesh->mNormals == (aiVector3D *)0x0 || uVar3 == 0) &&
       (bVar2 = aiMesh::HasTangentsAndBitangents(mesh), !bVar2)) {
      return;
    }
    aiMatrix3x3t<float>::aiMatrix3x3t(&local_80,mat);
    paVar4 = aiMatrix3x3t<float>::Inverse(&local_80);
    paVar4 = aiMatrix3x3t<float>::Transpose(paVar4);
    local_58.a1 = paVar4->a1;
    local_58.a2 = paVar4->a2;
    local_58.a3 = paVar4->a3;
    local_58.b1 = paVar4->b1;
    local_58.b2 = paVar4->b2;
    local_58.b3 = paVar4->b3;
    local_58.c1 = paVar4->c1;
    local_58.c2 = paVar4->c2;
    local_58.c3 = paVar4->c3;
    uVar3 = mesh->mNumVertices;
    if (uVar3 != 0 && mesh->mNormals != (aiVector3D *)0x0) {
      lVar7 = 0;
      for (uVar6 = 0; uVar6 < uVar3; uVar6 = uVar6 + 1) {
        aVar9 = ::operator*(&local_58,(aiVector3t<float> *)((long)&mesh->mNormals->x + lVar7));
        local_80.a3 = aVar9.z;
        local_80._0_8_ = aVar9._0_8_;
        paVar5 = aiVector3t<float>::Normalize((aiVector3t<float> *)&local_80);
        paVar1 = mesh->mNormals;
        *(undefined8 *)((long)&paVar1->x + lVar7) = *(undefined8 *)paVar5;
        *(float *)((long)&paVar1->z + lVar7) = paVar5->z;
        uVar3 = mesh->mNumVertices;
        lVar7 = lVar7 + 0xc;
      }
    }
    bVar2 = aiMesh::HasTangentsAndBitangents(mesh);
    if (bVar2) {
      lVar7 = 0;
      for (uVar6 = 0; uVar6 < mesh->mNumVertices; uVar6 = uVar6 + 1) {
        aVar9 = ::operator*(&local_58,(aiVector3t<float> *)((long)&mesh->mTangents->x + lVar7));
        local_80.a3 = aVar9.z;
        local_80._0_8_ = aVar9._0_8_;
        paVar5 = aiVector3t<float>::Normalize((aiVector3t<float> *)&local_80);
        paVar1 = mesh->mTangents;
        *(undefined8 *)((long)&paVar1->x + lVar7) = *(undefined8 *)paVar5;
        *(float *)((long)&paVar1->z + lVar7) = paVar5->z;
        aVar9 = ::operator*(&local_58,(aiVector3t<float> *)((long)&mesh->mBitangents->x + lVar7));
        local_80.a3 = aVar9.z;
        local_80._0_8_ = aVar9._0_8_;
        paVar5 = aiVector3t<float>::Normalize((aiVector3t<float> *)&local_80);
        paVar1 = mesh->mBitangents;
        *(undefined8 *)((long)&paVar1->x + lVar7) = *(undefined8 *)paVar5;
        *(float *)((long)&paVar1->z + lVar7) = paVar5->z;
        lVar7 = lVar7 + 0xc;
      }
    }
  }
  return;
}

Assistant:

void PretransformVertices::ApplyTransform(aiMesh *mesh, const aiMatrix4x4 &mat) const {
	// Check whether we need to transform the coordinates at all
	if (!mat.IsIdentity()) {

		// Check for odd negative scale (mirror)
		if (mesh->HasFaces() && mat.Determinant() < 0) {
			// Reverse the mesh face winding order
			FlipWindingOrderProcess::ProcessMesh(mesh);
		}

		// Update positions
		if (mesh->HasPositions()) {
			for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
				mesh->mVertices[i] = mat * mesh->mVertices[i];
			}
		}

		// Update normals and tangents
		if (mesh->HasNormals() || mesh->HasTangentsAndBitangents()) {
			const aiMatrix3x3 m = aiMatrix3x3(mat).Inverse().Transpose();

			if (mesh->HasNormals()) {
				for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
					mesh->mNormals[i] = (m * mesh->mNormals[i]).Normalize();
				}
			}
			if (mesh->HasTangentsAndBitangents()) {
				for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
					mesh->mTangents[i] = (m * mesh->mTangents[i]).Normalize();
					mesh->mBitangents[i] = (m * mesh->mBitangents[i]).Normalize();
				}
			}
		}
	}
}